

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O0

_Bool av1_ext_part_send_features
                (ExtPartController *ext_part_controller,aom_partition_features_t *features)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  aom_ext_part_status_t status;
  
  iVar1 = (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),in_RSI);
  return iVar1 == 0;
}

Assistant:

bool av1_ext_part_send_features(ExtPartController *ext_part_controller,
                                const aom_partition_features_t *features) {
  assert(ext_part_controller != NULL);
  assert(ext_part_controller->ready);
  assert(features != NULL);
  const aom_ext_part_status_t status = ext_part_controller->funcs.send_features(
      ext_part_controller->model, features);
  if (status != AOM_EXT_PART_OK) return false;
  return true;
}